

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output.cpp
# Opt level: O3

void __thiscall clickhouse::BufferedOutput::DoWrite(BufferedOutput *this,void *data,size_t len)

{
  ArrayOutput *pAVar1;
  
  pAVar1 = &this->array_output_;
  if ((ulong)((long)(this->array_output_).end_ - (long)(this->array_output_).buf_) < len) {
    (*(this->super_ZeroCopyOutput).super_OutputStream._vptr_OutputStream[2])();
    if ((ulong)((long)(this->buffer_).
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_finish -
               (long)(this->buffer_).
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start) >> 1 < len) {
      pAVar1 = (ArrayOutput *)this->slave_;
    }
  }
  (*(pAVar1->super_ZeroCopyOutput).super_OutputStream._vptr_OutputStream[3])(pAVar1,data,len);
  return;
}

Assistant:

void BufferedOutput::DoWrite(const void* data, size_t len) {
    if (array_output_.Avail() < len) {
        Flush();

        if (len > buffer_.size() / 2) {
            slave_->Write(data, len);
            return;
        }
    }

    array_output_.Write(data, len);
}